

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::insert_value_on_rehash
          (robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           *this,size_t ibucket,distance_type dist_from_ideal_bucket,truncated_hash_type hash,
          value_type *value)

{
  double dVar1;
  short sVar2;
  bucket_entry *pbVar3;
  unsigned_long uVar4;
  bucket_entry *pbVar5;
  
  pbVar3 = this->m_buckets;
  do {
    sVar2 = pbVar3[ibucket].m_dist_from_ideal_bucket;
    if (sVar2 < dist_from_ideal_bucket) {
      pbVar5 = pbVar3 + ibucket;
      if (sVar2 == -1) {
        dVar1 = value->second;
        *(unsigned_long *)pbVar5->m_value = value->first;
        *(double *)(pbVar5->m_value + 8) = dVar1;
        pbVar5->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
        return;
      }
      uVar4 = value->first;
      value->first = *(unsigned_long *)pbVar5->m_value;
      *(unsigned_long *)pbVar5->m_value = uVar4;
      dVar1 = value->second;
      value->second = *(double *)(pbVar5->m_value + 8);
      *(double *)(pbVar5->m_value + 8) = dVar1;
      pbVar5->m_dist_from_ideal_bucket = dist_from_ideal_bucket;
      dist_from_ideal_bucket = sVar2;
    }
    dist_from_ideal_bucket = dist_from_ideal_bucket + 1;
    ibucket = ibucket + 1 & (this->super_power_of_two_growth_policy<2UL>).m_mask;
  } while( true );
}

Assistant:

void insert_value_on_rehash(std::size_t ibucket,
                              distance_type dist_from_ideal_bucket,
                              truncated_hash_type hash, value_type&& value) {
    while (true) {
      if (dist_from_ideal_bucket >
          m_buckets[ibucket].dist_from_ideal_bucket()) {
        if (m_buckets[ibucket].empty()) {
          m_buckets[ibucket].set_value_of_empty_bucket(dist_from_ideal_bucket,
                                                       hash, std::move(value));
          return;
        } else {
          m_buckets[ibucket].swap_with_value_in_bucket(dist_from_ideal_bucket,
                                                       hash, value);
        }
      }

      dist_from_ideal_bucket++;
      ibucket = next_bucket(ibucket);
    }
  }